

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O2

u32 __thiscall irr::gui::CGUIListBox::addItem(CGUIListBox *this,wchar_t *text,s32 icon)

{
  pointer pLVar1;
  pointer pLVar2;
  ListItem i;
  
  ListItem::ListItem(&i);
  core::string<wchar_t>::operator=(&i.Text,text);
  i.Icon = icon;
  core::array<irr::gui::CGUIListBox::ListItem>::push_back(&this->Items,&i);
  recalculateItemHeight(this);
  recalculateItemWidth(this,icon);
  pLVar1 = (this->Items).m_data.
           super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar2 = (this->Items).m_data.
           super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ::std::__cxx11::wstring::_M_dispose();
  return (int)(((long)pLVar1 - (long)pLVar2) / 0x48) - 1;
}

Assistant:

u32 CGUIListBox::addItem(const wchar_t *text, s32 icon)
{
	ListItem i;
	i.Text = text;
	i.Icon = icon;

	Items.push_back(i);
	recalculateItemHeight();
	recalculateItemWidth(icon);

	return Items.size() - 1;
}